

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vminitim.cpp
# Opt level: O2

void vm_init_in_mem(vm_globals **vmg,vm_init_options *opts)

{
  uint *puVar1;
  int iVar2;
  undefined4 extraout_var;
  FILE *__stream;
  CVmVarHeapHybrid *this_00;
  CVmMemory *this_01;
  CVmUndo *this_02;
  CVmMetaTable *this_03;
  CVmBifTable *this_04;
  CVmTimeZoneCache *this_05;
  CVmSrcfTable *this_06;
  CVmBifTADSGlobals *this_07;
  undefined4 extraout_var_00;
  char *__format;
  EVP_PKEY_CTX *pEVar3;
  char *mapname;
  bool bVar4;
  bool bVar5;
  char acStack_1198 [32];
  char acStack_1178 [32];
  char acStack_1158 [32];
  char acStack_1138 [256];
  char acStack_1038 [4104];
  CResLoader *this;
  
  *vmg = (vm_globals *)0x0;
  err_init(0x400);
  iVar2 = (*opts->hostifc->_vptr_CVmHostIfc[7])();
  this = (CResLoader *)CONCAT44(extraout_var,iVar2);
  iVar2 = err_is_message_file_loaded();
  if (this != (CResLoader *)0x0 && iVar2 == 0) {
    __stream = (FILE *)CResLoader::open_res_file(this,"T3_VM.msg",(char *)0x0,"XMSG");
    if (__stream != (FILE *)0x0) {
      err_load_message_file
                ((osfildef *)__stream,&vm_messages,&vm_message_count,vm_messages_english,
                 vm_message_count_english);
      fclose(__stream);
    }
  }
  G_host_ifc_X = opts->hostifc;
  (*G_host_ifc_X->_vptr_CVmHostIfc[0x12])(G_host_ifc_X,acStack_1038,0x1000,7);
  pEVar3 = (EVP_PKEY_CTX *)0x1000;
  os_build_full_path(G_syslogfile_X,0x1000,acStack_1038,"tadslog.txt");
  CVmObjTable::init(&G_obj_table_X,pEVar3);
  this_00 = (CVmVarHeapHybrid *)operator_new(0x30);
  CVmVarHeapHybrid::CVmVarHeapHybrid(this_00,&G_obj_table_X);
  G_varheap_X = (CVmVarHeap *)this_00;
  this_01 = (CVmMemory *)operator_new(0x10);
  CVmMemory::CVmMemory(this_01,(CVmVarHeap *)this_00);
  G_mem_X = this_01;
  this_02 = (CVmUndo *)operator_new(0x38);
  CVmUndo::CVmUndo(this_02,0x1000,0x40);
  G_undo_X = this_02;
  this_03 = (CVmMetaTable *)operator_new(0x20);
  CVmMetaTable::CVmMetaTable(this_03,5);
  G_meta_table_X = this_03;
  this_04 = (CVmBifTable *)operator_new(0x20);
  pEVar3 = (EVP_PKEY_CTX *)0x5;
  CVmBifTable::CVmBifTable(this_04,5);
  G_bif_table_X = this_04;
  this_05 = (CVmTimeZoneCache *)operator_new(0x50);
  CVmTimeZoneCache::CVmTimeZoneCache(this_05);
  G_tzcache_X = this_05;
  vm_register_metaclasses();
  CVmObjTads::class_init();
  CVmRun::init(&G_interpreter_X,pEVar3);
  G_debugger_X = (CVmDebug *)0x0;
  G_srcf_table_X = (CVmSrcfTable *)0x0;
  G_net_config_X = (TadsNetConfig *)0x0;
  vm_init_debugger();
  this_06 = (CVmSrcfTable *)operator_new(0x18);
  CVmSrcfTable::CVmSrcfTable(this_06);
  G_predef_X.rterr = 0;
  G_predef_X.rterrmsg_prop = 0;
  G_predef_X.obj_construct = 0;
  G_predef_X.obj_destruct = 0;
  G_predef_X.last_prop = 0;
  G_predef_X.obj_call_prop = 0;
  G_predef_X.prop_not_defined_prop = 0;
  G_predef_X.stack_info_cls._0_2_ = 0;
  G_predef_X._18_8_ = 0;
  G_predef_X.const_str_obj = 0;
  G_predef_X.const_lst_obj = 0;
  G_predef_X.last_prop_obj = 0;
  G_predef_X.storage_server_error = 0;
  G_predef_X.string_sth_flags = 0;
  G_predef_X.string_sth_tag = 0;
  G_predef_X.gramprod_first_tok = 0;
  G_predef_X.gramprod_last_tok = 0;
  G_predef_X.gramprod_token_list = 0;
  G_predef_X.gramprod_token_match_list = 0;
  G_predef_X.gramprod_tag = 0;
  G_predef_X.misc_vocab = 0;
  G_predef_X.gramprod_alt_props = 0;
  G_predef_X.gramprod_gram_alt_info = 0;
  G_predef_X.gramprod_gram_alt_tok_info = 0;
  G_predef_X.charset_unknown_exc = 0;
  G_predef_X.file_not_found_exc = 0;
  G_predef_X.file_creation_exc = 0;
  G_predef_X.file_open_exc = 0;
  G_predef_X.file_io_exc = 0;
  G_predef_X.file_sync_exc = 0;
  G_predef_X.file_closed_exc = 0;
  G_predef_X.file_mode_exc = 0;
  G_predef_X.file_safety_exc = 0;
  G_predef_X.filespec_getFilename = 0;
  G_predef_X.filespec_closeFile = 0;
  G_predef_X.file_info = 0;
  G_predef_X.compiler_exc = 0;
  G_predef_X.calc_hash_prop = 0;
  G_predef_X.match_values_prop = 0;
  G_predef_X.operator_add = 0;
  G_predef_X.operator_sub = 0;
  G_predef_X.operator_mul = 0;
  G_predef_X.operator_div = 0;
  G_predef_X.operator_mod = 0;
  G_predef_X.operator_xor = 0;
  G_predef_X.operator_shl = 0;
  G_predef_X.operator_ashr = 0;
  G_predef_X.operator_lshr = 0;
  G_predef_X.operator_bit_not = 0;
  G_predef_X.operator_bit_and = 0;
  G_predef_X.operator_bit_or = 0;
  G_predef_X.operator_neg = 0;
  G_predef_X.operator_idx = 0;
  G_predef_X.operator_setidx = 0;
  G_predef_X.net_exception = 0;
  G_predef_X.net_reset_exception = 0;
  G_predef_X.net_safety_exception = 0;
  G_predef_X.net_event = 0;
  G_predef_X.net_request_event = 0;
  G_predef_X.net_timeout_event = 0;
  G_predef_X.net_reply_event._0_2_ = 0;
  G_predef_X._182_6_ = 0;
  G_predef_X.file_upload_cl._0_2_ = 0;
  G_predef_X._190_8_ = 0;
  G_predef_X.reflection_services = 0;
  G_predef_X.reflection_valToSymbol = 0;
  G_predef_X.objToString = 0;
  G_preinit_mode_X = 0;
  G_srcf_table_X = this_06;
  this_07 = (CVmBifTADSGlobals *)operator_new(0x30);
  CVmBifTADSGlobals::CVmBifTADSGlobals(this_07);
  G_bif_tads_globals_X = this_07;
  CVmObjBigNum::init_cache();
  G_image_loader_X = (CVmImageLoader *)0x0;
  mapname = opts->charset;
  if (mapname == (char *)0x0) {
    mapname = acStack_1158;
    os_get_charmap(mapname,1);
    G_disp_cset_name_X = (char *)0x0;
  }
  else {
    G_disp_cset_name_X = lib_copy_str(mapname);
  }
  G_cmap_from_ui_X = CCharmapToUni::load(this,mapname);
  G_cmap_to_ui_X = CCharmapToLocal::load(this,mapname);
  os_get_charmap(acStack_1178,2);
  G_cmap_from_fname_X = CCharmapToUni::load(this,acStack_1178);
  G_cmap_to_fname_X = CCharmapToLocal::load(this,acStack_1178);
  os_get_charmap(acStack_1198,3);
  G_cmap_from_file_X = CCharmapToUni::load(this,acStack_1198);
  G_cmap_to_file_X = CCharmapToLocal::load(this,acStack_1198);
  if (opts->log_charset == (char *)0x0) {
    G_cmap_to_log_X = G_cmap_to_file_X;
    if (G_cmap_to_file_X != (CCharmapToLocal *)0x0) {
      puVar1 = &(G_cmap_to_file_X->super_CCharmap).ref_cnt_;
      *puVar1 = *puVar1 + 1;
    }
  }
  else {
    G_cmap_to_log_X = CCharmapToLocal::load(this,opts->log_charset);
  }
  bVar4 = G_cmap_from_ui_X == (CCharmapToUni *)0x0;
  bVar5 = G_cmap_to_ui_X == (CCharmapToLocal *)0x0;
  if (G_cmap_from_ui_X == (CCharmapToUni *)0x0) {
    G_cmap_from_ui_X = CCharmapToUni::load(this,"us-ascii");
  }
  if (G_cmap_to_ui_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_ui_X = CCharmapToLocal::load(this,"us-ascii");
  }
  if (G_cmap_from_fname_X == (CCharmapToUni *)0x0) {
    G_cmap_from_fname_X = CCharmapToUni::load(this,"us-ascii");
  }
  if (G_cmap_to_fname_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_fname_X = CCharmapToLocal::load(this,"us-ascii");
  }
  if (G_cmap_from_file_X == (CCharmapToUni *)0x0) {
    G_cmap_from_file_X = CCharmapToUni::load(this,"us-ascii");
  }
  if (G_cmap_to_file_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_file_X = CCharmapToLocal::load(this,"us-ascii");
  }
  if (G_cmap_to_log_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_log_X = CCharmapToLocal::load(this,"us-ascii");
  }
  iVar2 = (*opts->clientifc->_vptr_CVmMainClientIfc[3])(opts->clientifc,0);
  G_console_X = (CVmConsoleMain *)CONCAT44(extraout_var_00,iVar2);
  if (bVar4 || bVar5) {
    __format = err_get_msg(vm_messages,vm_message_count,0x906,1);
    sprintf(acStack_1138,__format,mapname);
    (*opts->clientifc->_vptr_CVmMainClientIfc[10])(opts->clientifc,0,0,acStack_1138,1);
  }
  return;
}

Assistant:

void vm_init_in_mem(vm_globals **vmg, const vm_init_options *opts)
{
    /* initialize the base VM structures */
    vm_init_base(vmg, opts);

    /* 
     *   assign the global pointer to the special vmg__ local for
     *   globals-on-stack configuration 
     */
    vm_globals *vmg__ = *vmg;

    /* 
     *   explicitly mark vmg__ as reference, in case we don't happen to use
     *   it in this build configuration 
     */
    (void)vmg__;

    /* create the in-memory pools */
    VM_IF_ALLOC_PRE_GLOBAL(G_code_pool = new CVmPoolInMem());
    VM_IF_ALLOC_PRE_GLOBAL(G_const_pool = new CVmPoolInMem());
}